

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O0

Result __thiscall
wabt::interp::anon_unknown_1::BinaryReaderInterp::OnI32ConstExpr
          (BinaryReaderInterp *this,uint32_t value)

{
  bool bVar1;
  Type local_48;
  Location local_40;
  Enum local_20;
  uint32_t local_1c;
  BinaryReaderInterp *pBStack_18;
  uint32_t value_local;
  BinaryReaderInterp *this_local;
  
  local_1c = value;
  pBStack_18 = this;
  GetLocation(&local_40,this);
  Type::Type(&local_48,I32);
  local_20 = (Enum)SharedValidator::OnConst(&this->validator_,&local_40,local_48);
  bVar1 = Failed((Result)local_20);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    Istream::Emit(this->istream_,I32Const,local_1c);
    Result::Result((Result *)((long)&this_local + 4),Ok);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReaderInterp::OnI32ConstExpr(uint32_t value) {
  CHECK_RESULT(validator_.OnConst(GetLocation(), Type::I32));
  istream_.Emit(Opcode::I32Const, value);
  return Result::Ok;
}